

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFExpression::Operation::print
          (Operation *this,raw_ostream *OS,DWARFExpression *Expr,MCRegisterInfo *RegInfo,
          DWARFUnit *U,bool isEH)

{
  Encoding EVar1;
  bool bVar2;
  Tag TVar3;
  uint uVar4;
  uint64_t uVar5;
  raw_ostream *prVar6;
  DWARFFormValue *this_00;
  Optional<const_char_*> OVar7;
  format_object<unsigned_long> local_168;
  uint64_t local_150;
  format_object<long> local_148;
  uint8_t local_129;
  format_object<unsigned_char> local_128;
  uint local_10c;
  uint64_t uStack_108;
  uint i;
  uint64_t Offset;
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 local_e8;
  undefined1 local_e0;
  undefined1 local_d8 [8];
  Optional<llvm::DWARFFormValue> Name_1;
  format_object<unsigned_long> local_98;
  undefined1 local_80 [8];
  DWARFDie Die;
  uint Signed;
  uint Size;
  uint Operand;
  undefined1 local_50 [8];
  StringRef Name;
  bool isEH_local;
  DWARFUnit *U_local;
  MCRegisterInfo *RegInfo_local;
  DWARFExpression *Expr_local;
  raw_ostream *OS_local;
  Operation *this_local;
  
  Name.Length._7_1_ = isEH;
  if ((this->Error & 1U) == 0) {
    _local_50 = dwarf::OperationEncodingString((uint)this->Opcode);
    bVar2 = StringRef::empty((StringRef *)local_50);
    if (bVar2) {
      __assert_fail("!Name.empty() && \"DW_OP has no name!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                    ,0xf8,
                    "bool llvm::DWARFExpression::Operation::print(raw_ostream &, const DWARFExpression *, const MCRegisterInfo *, DWARFUnit *, bool)"
                   );
    }
    raw_ostream::operator<<(OS,_local_50);
    if (((((this->Opcode < 0x70) || (0x8f < this->Opcode)) &&
         ((this->Opcode < 0x50 || (0x6f < this->Opcode)))) &&
        ((this->Opcode != 0x92 && (this->Opcode != 0x90)))) ||
       (bVar2 = prettyPrintRegisterOp
                          (OS,this->Opcode,this->Operands,RegInfo,(bool)(Name.Length._7_1_ & 1)),
       !bVar2)) {
      for (Signed = 0; Signed < 2; Signed = Signed + 1) {
        EVar1 = (this->Desc).Op[Signed];
        uVar4 = (uint)EVar1;
        Die.Die._4_4_ = uVar4 & 0x80;
        if (uVar4 == 0xff) break;
        if ((uVar4 == 8) && (U != (DWARFUnit *)0x0)) {
          uVar5 = DWARFUnit::getOffset(U);
          _local_80 = DWARFUnit::getDIEForOffset(U,uVar5 + this->Operands[Signed]);
          bVar2 = DWARFDie::operator_cast_to_bool((DWARFDie *)local_80);
          if ((bVar2) && (TVar3 = DWARFDie::getTag((DWARFDie *)local_80), TVar3 == DW_TAG_base_type)
             ) {
            uVar5 = DWARFUnit::getOffset(U);
            Name_1.Storage._48_8_ = uVar5 + this->Operands[Signed];
            format<unsigned_long>(&local_98," (0x%08lx)",(unsigned_long *)&Name_1.Storage.hasVal);
            raw_ostream::operator<<(OS,&local_98.super_format_object_base);
            DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_d8,(DWARFDie *)local_80,
                           DW_AT_name);
            bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_d8);
            if (bVar2) {
              prVar6 = raw_ostream::operator<<(OS," \"");
              this_00 = Optional<llvm::DWARFFormValue>::operator->
                                  ((Optional<llvm::DWARFFormValue> *)local_d8);
              OVar7 = DWARFFormValue::getAsCString(this_00);
              local_e8 = OVar7.Storage.field_0;
              local_e0 = OVar7.Storage.hasVal;
              prVar6 = llvm::operator<<(prVar6,(Optional<const_char_*> *)&local_e8);
              raw_ostream::operator<<(prVar6,"\"");
            }
          }
          else {
            format<unsigned_long>
                      ((format_object<unsigned_long> *)&Offset," <invalid base_type ref: 0x%lx>",
                       this->Operands + Signed);
            raw_ostream::operator<<(OS,(format_object_base *)&Offset);
          }
        }
        else if (uVar4 == 7) {
          uStack_108 = this->Operands[Signed];
          for (local_10c = 0; (ulong)local_10c < this->Operands[Signed - 1];
              local_10c = local_10c + 1) {
            local_129 = DataExtractor::getU8(&Expr->Data,&stack0xfffffffffffffef8,(Error *)0x0);
            format<unsigned_char>(&local_128," 0x%02x",&local_129);
            raw_ostream::operator<<(OS,&local_128.super_format_object_base);
          }
        }
        else if ((EVar1 & SignBit) == Size1) {
          if ((this->Opcode != 0xa3) && (this->Opcode != 0xf3)) {
            format<unsigned_long>(&local_168," 0x%lx",this->Operands + Signed);
            raw_ostream::operator<<(OS,&local_168.super_format_object_base);
          }
        }
        else {
          local_150 = this->Operands[Signed];
          format<long>(&local_148," %+ld",(long *)&local_150);
          raw_ostream::operator<<(OS,&local_148.super_format_object_base);
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    raw_ostream::operator<<(OS,"<decoding error>");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DWARFExpression::Operation::print(raw_ostream &OS,
                                       const DWARFExpression *Expr,
                                       const MCRegisterInfo *RegInfo,
                                       DWARFUnit *U,
                                       bool isEH) {
  if (Error) {
    OS << "<decoding error>";
    return false;
  }

  StringRef Name = OperationEncodingString(Opcode);
  assert(!Name.empty() && "DW_OP has no name!");
  OS << Name;

  if ((Opcode >= DW_OP_breg0 && Opcode <= DW_OP_breg31) ||
      (Opcode >= DW_OP_reg0 && Opcode <= DW_OP_reg31) ||
      Opcode == DW_OP_bregx || Opcode == DW_OP_regx)
    if (prettyPrintRegisterOp(OS, Opcode, Operands, RegInfo, isEH))
      return true;

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];
    unsigned Signed = Size & Operation::SignBit;

    if (Size == Operation::SizeNA)
      break;

    if (Size == Operation::BaseTypeRef && U) {
      auto Die = U->getDIEForOffset(U->getOffset() + Operands[Operand]);
      if (Die && Die.getTag() == dwarf::DW_TAG_base_type) {
        OS << format(" (0x%08" PRIx64 ")", U->getOffset() + Operands[Operand]);
        if (auto Name = Die.find(dwarf::DW_AT_name))
          OS << " \"" << Name->getAsCString() << "\"";
      } else {
        OS << format(" <invalid base_type ref: 0x%" PRIx64 ">",
                     Operands[Operand]);
      }
    } else if (Size == Operation::SizeBlock) {
      uint64_t Offset = Operands[Operand];
      for (unsigned i = 0; i < Operands[Operand - 1]; ++i)
        OS << format(" 0x%02x", Expr->Data.getU8(&Offset));
    } else {
      if (Signed)
        OS << format(" %+" PRId64, (int64_t)Operands[Operand]);
      else if (Opcode != DW_OP_entry_value &&
               Opcode != DW_OP_GNU_entry_value)
        OS << format(" 0x%" PRIx64, Operands[Operand]);
    }
  }
  return true;
}